

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::
     throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,std::fpos<__mbstate_t>,char_const*,std::fpos<__mbstate_t>>
               (char *args,path args_1,char *args_2,fpos<__mbstate_t> args_3,char *args_4,
               fpos<__mbstate_t> args_5)

{
  path args_00;
  fpos<__mbstate_t> args_4_00;
  runtime_error *this;
  __mbstate_t in_R9;
  fpos<__mbstate_t> args_2_00;
  stringstream msg;
  undefined8 in_stack_fffffffffffffde8;
  __mbstate_t in_stack_fffffffffffffe00;
  path local_1e0;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Catch::clara::std::filesystem::__cxx11::path::path(&local_1e0,(path *)args_2);
  args_00._M_pathname._M_string_length = (size_type)args_4;
  args_00._M_pathname._M_dataplus._M_p = (pointer)args_3._M_state;
  args_00._M_pathname.field_2._M_allocated_capacity = (size_type)args_1._M_pathname._M_dataplus._M_p
  ;
  args_00._M_pathname.field_2._8_8_ = args_1._M_pathname._M_string_length;
  args_00._32_8_ = in_stack_fffffffffffffde8;
  args_4_00._M_state = in_stack_fffffffffffffe00;
  args_4_00._M_off = (streamoff)args_4;
  args_2_00._M_state = in_R9;
  args_2_00._M_off = args_3._M_off;
  detail::
  make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
  ::operator()((make_exception<const_char_*,_std::filesystem::__cxx11::path,_const_char_*,_std::fpos<__mbstate_t>,_const_char_*,_std::fpos<__mbstate_t>_>
                *)&stack0xfffffffffffffe00,(stringstream *)local_1b8,args,args_00,(char *)&local_1e0
               ,args_2_00,(char *)args_3._M_state,args_4_00);
  Catch::clara::std::filesystem::__cxx11::path::~path(&local_1e0);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)&stack0xfffffffffffffe00);
  *(undefined ***)this = &PTR__runtime_error_001aca18;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}